

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

int __thiscall AddrInfo::GetTriedBucket(AddrInfo *this,uint256 *nKey,NetGroupManager *netgroupman)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CNetAddr *in_RDX;
  NetGroupManager *in_RSI;
  long in_FS_OFFSET;
  uint64_t hash2;
  uint64_t hash1;
  HashWriter *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  HashWriter *in_stack_fffffffffffffe48;
  CService *in_stack_fffffffffffffe68;
  undefined1 local_158;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  HashWriter::HashWriter(in_stack_fffffffffffffe38);
  HashWriter::operator<<
            (in_stack_fffffffffffffe48,
             (uint256 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  CService::GetKey(in_stack_fffffffffffffe68);
  HashWriter::operator<<
            (in_stack_fffffffffffffe48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  HashWriter::GetCheapHash(in_stack_fffffffffffffe48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
  HashWriter::HashWriter(in_stack_fffffffffffffe38);
  HashWriter::operator<<
            (in_stack_fffffffffffffe48,
             (uint256 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  NetGroupManager::GetGroup(in_RSI,in_RDX);
  HashWriter::operator<<
            (in_stack_fffffffffffffe48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  HashWriter::operator<<
            (in_stack_fffffffffffffe48,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            HashWriter::GetCheapHash(in_stack_fffffffffffffe48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  local_158 = (byte)this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint)local_158;
  }
  __stack_chk_fail();
}

Assistant:

int AddrInfo::GetTriedBucket(const uint256& nKey, const NetGroupManager& netgroupman) const
{
    uint64_t hash1 = (HashWriter{} << nKey << GetKey()).GetCheapHash();
    uint64_t hash2 = (HashWriter{} << nKey << netgroupman.GetGroup(*this) << (hash1 % ADDRMAN_TRIED_BUCKETS_PER_GROUP)).GetCheapHash();
    return hash2 % ADDRMAN_TRIED_BUCKET_COUNT;
}